

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.hpp
# Opt level: O0

SPxId __thiscall soplex::SPxAutoPR<double>::selectEnter(SPxAutoPR<double> *this)

{
  bool bVar1;
  Verbosity VVar2;
  SPxOut *manip;
  DataKey DVar3;
  SPxOut *in_RDI;
  Verbosity old_verbosity;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  bVar1 = setActivePricer((SPxAutoPR<double> *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          (Type)((ulong)in_RDI >> 0x20));
  if (((bVar1) && (in_RDI->m_streams[0x123] != (ostream *)0x0)) &&
     (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI->m_streams[0x123]), 2 < (int)VVar2)) {
    SPxOut::getVerbosity((SPxOut *)in_RDI->m_streams[0x123]);
    (**(code **)(*(long *)in_RDI->m_streams[0x123] + 0x10))
              (in_RDI->m_streams[0x123],&stack0xffffffffffffffe8);
    manip = soplex::operator<<(in_RDI,in_stack_ffffffffffffffd8);
    (**(code **)*in_RDI[2].m_streams)();
    soplex::operator<<(in_RDI,(char *)manip);
    soplex::operator<<(in_RDI,(_func_ostream_ptr_ostream_ptr *)manip);
    (**(code **)(*(long *)in_RDI->m_streams[0x123] + 0x10))
              (in_RDI->m_streams[0x123],&stack0xffffffffffffffec);
  }
  DVar3 = (DataKey)(**(code **)(*in_RDI[2].m_streams + 0x58))();
  return (SPxId)DVar3;
}

Assistant:

SPxId SPxAutoPR<R>::selectEnter()
{
   if(setActivePricer(SPxSolverBase<R>::ENTER))
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- active pricer: " << activepricer->getName() << std::endl;)

      return activepricer->selectEnter();
}